

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O1

void __thiscall
UnifiedRegex::SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::
SyncToLiteralAndBackupInstT
          (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,InstTag tag,
          CharCount offset,CharCount length,CountDomain *backup)

{
  (this->super_Inst).tag = tag;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.offset = offset;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.length = length;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.isInMap.data[0].
  word = 0;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.isInMap.data[1].
  word = 0;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.isInMap.data[2].
  word = 0;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.isInMap.data[3].
  word = 0;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.defv = -1;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.root = (Type)0x0;
  memset((this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.directMap,
         0xff,0x400);
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.goodSuffix.ptr = (int *)0x0;
  (this->super_BackupMixin).backup = *backup;
  return;
}

Assistant:

SyncToLiteralAndBackupInstT(InstTag tag, CharCount offset, CharCount length, const CountDomain& backup) : Inst(tag), ScannerT(offset, length), BackupMixin(backup) {}